

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat operator+(Mat *left,Mat *right)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  ostream *poVar6;
  int *in_RDX;
  long lVar7;
  Mat MVar8;
  
  if ((right->n_rows_ == *in_RDX) && (right->n_cols_ == in_RDX[1])) {
    Mat::Mat(left,right->n_rows_,right->n_cols_);
    iVar1 = right->n_rows_;
    iVar2 = right->n_cols_;
    pdVar3 = right->v_;
    pdVar4 = *(double **)(in_RDX + 2);
    pdVar5 = left->v_;
    for (lVar7 = 0; lVar7 < (long)iVar2 * (long)iVar1; lVar7 = lVar7 + 1) {
      pdVar5[lVar7] = pdVar3[lVar7] + pdVar4[lVar7];
    }
    MVar8.v_ = pdVar4;
    MVar8._0_8_ = left;
    return MVar8;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Incompatible shape in +(Matrix,Matrix)");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(1);
}

Assistant:

Mat operator + (const Mat& left, const Mat& right)
{
	if ( (left.n_rows_!=right.n_rows_) || (left.n_cols_!=right.n_cols_) ) {
		cerr << "ERROR: Incompatible shape in +(Matrix,Matrix)" << endl;
		exit(1);
	};
	Mat Aux(left.n_rows_,left.n_cols_);
	for (int i=0; i<left.n_rows_*left.n_cols_; i++) 	
		Aux.v_[i] = left.v_[i] + right.v_[i];
	return Aux;
}